

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

int Wlc_PrsCheckBitConst0(Wlc_Ntk_t *p,int NameId)

{
  int Id;
  Wlc_Obj_t *p_00;
  uint *puVar1;
  uint uVar2;
  
  p_00 = Wlc_NtkObj(p,NameId);
  uVar2 = 0;
  if (p_00->End == p_00->Beg) {
    while ((*(ushort *)p_00 & 0x3f) == 7) {
      Id = Wlc_ObjFaninId0(p_00);
      p_00 = Wlc_NtkObj(p,Id);
    }
    uVar2 = 0;
    if ((*(ushort *)p_00 & 0x3f) == 6) {
      puVar1 = (uint *)Wlc_ObjConstValue(p_00);
      uVar2 = ~*puVar1 & 1;
    }
  }
  return uVar2;
}

Assistant:

int Wlc_PrsCheckBitConst0( Wlc_Ntk_t * p, int NameId )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, NameId );
    int * pInits;
    if ( Wlc_ObjRange(pObj) != 1 )
        return 0;
    while ( pObj->Type == WLC_OBJ_BUF )
        pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
    if ( pObj->Type != WLC_OBJ_CONST )
        return 0;
    pInits = Wlc_ObjConstValue(pObj);
    return Abc_InfoHasBit((unsigned *)pInits, 0) == 0;
}